

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

int js_parse_skip_parens_token(JSParseState *s,int *pbits,BOOL no_line_terminator)

{
  JSToken *token;
  uint uVar1;
  BOOL BVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  JSParsePos pos;
  char state [256];
  
  state[0] = '\0';
  pos.last_line_num = s->last_line_num;
  pos.line_num = (s->token).line_num;
  pos.ptr = (s->token).ptr;
  pos.got_lf = s->got_lf;
  token = &s->token;
  iVar4 = 0;
  uVar8 = 1;
  uVar6 = 0;
  do {
    iVar3 = token->val;
    if (iVar3 != -0x7e) {
      lVar5 = -2;
      if (iVar3 == -0x7a) {
LAB_00148e38:
        if ((((0x32 < iVar4 + 0x80U) ||
             ((0x438000030001bU >> ((ulong)(iVar4 + 0x80U) & 0x3f) & 1) == 0)) && (iVar4 != 0x29))
           && ((iVar4 != 0x5d && (iVar4 != 0x7d)))) {
          s->buf_ptr = s->buf_ptr + lVar5;
          iVar4 = js_parse_regexp(s);
          if (iVar4 != 0) goto LAB_00148f6d;
        }
        goto LAB_00148f1b;
      }
      if (iVar3 == -0x5b) {
        if (uVar8 == 2) {
          uVar6 = uVar6 | 2;
        }
        iVar4 = -0x5b;
        goto LAB_00148f37;
      }
      if (iVar3 == 0x28) goto LAB_00148ed7;
      if (iVar3 == 0x29) {
        if (state[uVar8 - 1] == '(') {
LAB_00148f18:
          uVar8 = uVar8 - 1;
          goto LAB_00148f1b;
        }
        goto LAB_00148f6d;
      }
      if (iVar3 == 0x2f) {
        lVar5 = -1;
        goto LAB_00148e38;
      }
      if (iVar3 == 0x3b) {
        uVar6 = uVar6 | uVar8 == 2;
        iVar4 = 0x3b;
        goto LAB_00148f37;
      }
      if (iVar3 == 0x3d) {
        uVar6 = uVar6 | 4;
        iVar4 = 0x3d;
        goto LAB_00148f37;
      }
      if (iVar3 == 0x5b) {
LAB_00148ed7:
        if (uVar8 < 0x100) {
          state[uVar8] = (char)iVar3;
          uVar8 = uVar8 + 1;
          goto LAB_00148f1b;
        }
LAB_00148f6d:
        uVar7 = 0xffffffaa;
      }
      else {
        if (iVar3 == 0x5d) {
          if (state[uVar8 - 1] == '[') goto LAB_00148f18;
          goto LAB_00148f6d;
        }
        if (iVar3 == 0x7b) goto LAB_00148ed7;
        if (iVar3 == 0x7d) {
          lVar5 = uVar8 - 1;
          uVar8 = uVar8 - 1;
          if (state[lVar5] == '{') {
            iVar4 = 0x7d;
            goto LAB_00148f37;
          }
          if (state[lVar5] == '`') {
            free_token(s,token);
            s->got_lf = 0;
            s->last_line_num = (s->token).line_num;
            iVar4 = js_parse_template_part(s,s->buf_ptr);
            if (iVar4 == 0) goto LAB_00148ecf;
          }
          goto LAB_00148f6d;
        }
        if (iVar3 != -0x56) goto LAB_00148f1e;
        uVar7 = 0xffffffaa;
      }
      goto LAB_00148fa9;
    }
LAB_00148ecf:
    if ((s->token).u.str.sep != 0x60) {
      iVar3 = 0x60;
      goto LAB_00148ed7;
    }
LAB_00148f1b:
    iVar3 = token->val;
LAB_00148f1e:
    iVar4 = iVar3;
    if (iVar3 == -0x7d) {
      BVar2 = token_is_pseudo_keyword(s,0x43);
      if (BVar2 == 0) {
        BVar2 = token_is_pseudo_keyword(s,0x2d);
        iVar4 = -0x27;
        if (BVar2 == 0) {
          iVar4 = -0x7d;
        }
      }
      else {
        iVar4 = -0x27;
      }
    }
LAB_00148f37:
    iVar3 = next_token(s);
    if (iVar3 != 0) goto LAB_00148f6d;
  } while (1 < uVar8);
  uVar1 = (s->token).val;
  BVar2 = token_is_pseudo_keyword(s,0x43);
  uVar7 = 0xffffffd9;
  if (BVar2 == 0) {
    uVar7 = uVar1;
  }
  if ((no_line_terminator != 0) && (s->last_line_num != (s->token).line_num)) {
    uVar7 = 10;
  }
LAB_00148fa9:
  if (pbits != (int *)0x0) {
    *pbits = uVar6;
  }
  iVar4 = js_parse_seek_token(s,&pos);
  return -(uint)(iVar4 != 0) | uVar7;
}

Assistant:

static int js_parse_skip_parens_token(JSParseState *s, int *pbits, BOOL no_line_terminator)
{
    char state[256];
    size_t level = 0;
    JSParsePos pos;
    int last_tok, tok = TOK_EOF;
    int c, tok_len, bits = 0;

    /* protect from underflow */
    state[level++] = 0;

    js_parse_get_pos(s, &pos);
    last_tok = 0;
    for (;;) {
        switch(s->token.val) {
        case '(':
        case '[':
        case '{':
            if (level >= sizeof(state))
                goto done;
            state[level++] = s->token.val;
            break;
        case ')':
            if (state[--level] != '(')
                goto done;
            break;
        case ']':
            if (state[--level] != '[')
                goto done;
            break;
        case '}':
            c = state[--level];
            if (c == '`') {
                /* continue the parsing of the template */
                free_token(s, &s->token);
                /* Resume TOK_TEMPLATE parsing (s->token.line_num and
                 * s->token.ptr are OK) */
                s->got_lf = FALSE;
                s->last_line_num = s->token.line_num;
                if (js_parse_template_part(s, s->buf_ptr))
                    goto done;
                goto handle_template;
            } else if (c != '{') {
                goto done;
            }
            break;
        case TOK_TEMPLATE:
        handle_template:
            if (s->token.u.str.sep != '`') {
                /* '${' inside the template : closing '}' and continue
                   parsing the template */
                if (level >= sizeof(state))
                    goto done;
                state[level++] = '`';
            } 
            break;
        case TOK_EOF:
            goto done;
        case ';':
            if (level == 2) {
                bits |= SKIP_HAS_SEMI;
            }
            break;
        case TOK_ELLIPSIS:
            if (level == 2) {
                bits |= SKIP_HAS_ELLIPSIS;
            }
            break;
        case '=':
            bits |= SKIP_HAS_ASSIGNMENT;
            break;
            
        case TOK_DIV_ASSIGN:
            tok_len = 2;
            goto parse_regexp;
        case '/':
            tok_len = 1;
        parse_regexp:
            if (is_regexp_allowed(last_tok)) {
                s->buf_ptr -= tok_len;
                if (js_parse_regexp(s)) {
                    /* XXX: should clear the exception */
                    goto done;
                }
            }
            break;
        }
        /* last_tok is only used to recognize regexps */
        if (s->token.val == TOK_IDENT &&
            (token_is_pseudo_keyword(s, JS_ATOM_of) ||
             token_is_pseudo_keyword(s, JS_ATOM_yield))) {
            last_tok = TOK_OF;
        } else {
            last_tok = s->token.val;
        }
        if (next_token(s)) {
            /* XXX: should clear the exception generated by next_token() */
            break;
        }
        if (level <= 1) {
            tok = s->token.val;
            if (token_is_pseudo_keyword(s, JS_ATOM_of))
                tok = TOK_OF;
            if (no_line_terminator && s->last_line_num != s->token.line_num)
                tok = '\n';
            break;
        }
    }
 done:
    if (pbits) {
        *pbits = bits;
    }
    if (js_parse_seek_token(s, &pos))
        return -1;
    return tok;
}